

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O3

void write_scaling_list(bs_t *b,int *scalingList,int sizeOfScalingList,
                       int *useDefaultScalingMatrixFlag)

{
  int iVar1;
  int iVar2;
  uint32_t v;
  ulong uVar3;
  bool bVar4;
  
  if (0 < sizeOfScalingList) {
    iVar1 = 8;
    uVar3 = 0;
    iVar2 = 8;
    do {
      bVar4 = iVar2 != 0;
      iVar2 = 0;
      if (bVar4) {
        if (*useDefaultScalingMatrixFlag == 0) {
          iVar2 = scalingList[uVar3];
        }
        iVar1 = (iVar2 - iVar1) % 0x100;
        v = iVar1 * 2 - 1;
        if (iVar1 < 1) {
          v = iVar1 * -2;
        }
        bs_write_ue(b,v);
      }
      iVar1 = scalingList[uVar3];
      uVar3 = uVar3 + 1;
    } while ((uint)sizeOfScalingList != uVar3);
  }
  return;
}

Assistant:

void write_scaling_list(bs_t* b, int* scalingList, int sizeOfScalingList, int* useDefaultScalingMatrixFlag )
{
    // NOTE need to be able to set useDefaultScalingMatrixFlag when reading, hence passing as pointer
    int lastScale = 8;
    int nextScale = 8;
    int delta_scale;
    for( int j = 0; j < sizeOfScalingList; j++ )
    {
        if( nextScale != 0 )
        {
            if( 1 )
            {
                nextScale = scalingList[ j ];
                if (useDefaultScalingMatrixFlag[0]) { nextScale = 0; }
                delta_scale = (nextScale - lastScale) % 256 ;
            }

            bs_write_se(b, delta_scale);

            if( 0 )
            {
                nextScale = ( lastScale + delta_scale + 256 ) % 256;
                useDefaultScalingMatrixFlag[0] = ( j == 0 && nextScale == 0 );
            }
        }
        if( 0 )
        {
            scalingList[ j ] = ( nextScale == 0 ) ? lastScale : nextScale;
        }
        lastScale = scalingList[ j ];
    }
}